

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Session.cpp
# Opt level: O3

int __thiscall
FIX::Session::verify
          (Session *this,EVP_PKEY_CTX *ctx,uchar *sig,size_t siglen,uchar *tbs,size_t tbslen)

{
  FieldMap *this_00;
  IntTConvertor<unsigned_long> *this_01;
  pointer pcVar1;
  bool bVar2;
  FieldBase *msgType;
  FieldBase *senderCompID;
  FieldBase *targetCompID;
  FieldBase *pFVar3;
  uint64_t uVar4;
  SEQNUM SVar5;
  IntTConvertor<unsigned_long> *pIVar6;
  undefined8 *puVar7;
  long *plVar8;
  undefined8 extraout_RAX;
  logic_error *this_02;
  char *__s;
  unsigned_long value;
  byte bVar9;
  Session *pSVar10;
  undefined1 auVar11 [12];
  byte local_144;
  FieldBase *local_138;
  undefined1 local_128 [32];
  undefined1 local_108 [16];
  undefined1 auStack_f8 [16];
  _func_int *local_e8 [2];
  _Alloc_hider local_d8;
  Application *local_d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_c8;
  field_metrics local_b8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  string local_70;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_50;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_40;
  
  this_00 = (FieldMap *)(ctx + 0x70);
  msgType = FieldMap::getFieldRef(this_00,0x23);
  senderCompID = FieldMap::getFieldRef(this_00,0x31);
  targetCompID = FieldMap::getFieldRef(this_00,0x38);
  pFVar3 = FieldMap::getFieldRef(this_00,0x34);
  local_144 = (byte)siglen;
  bVar9 = (byte)sig | local_144;
  if (bVar9 == 1) {
    local_138 = FieldMap::getFieldRef(this_00,0x22);
  }
  else {
    local_138 = (FieldBase *)0x0;
  }
  bVar2 = validLogonState(this,(MsgType *)msgType);
  if (!bVar2) {
    this_02 = (logic_error *)__cxa_allocate_exception(0x10);
    std::logic_error::logic_error(this_02,"Logon state is not valid for message");
    __cxa_throw(this_02,&std::logic_error::typeinfo,std::logic_error::~logic_error);
  }
  bVar2 = isGoodTime(this,(SendingTime *)pFVar3);
  if (!bVar2) {
    doBadTime(this,(Message *)ctx);
    return 0;
  }
  bVar2 = isCorrectCompID(this,(SenderCompID *)senderCompID,(TargetCompID *)targetCompID);
  if (!bVar2) {
    doBadCompID(this,(Message *)ctx);
    return 0;
  }
  pSVar10 = this;
  if ((byte)sig == 0) {
    if (local_144 != 0) goto LAB_001a55ef;
    if (bVar9 == 0) goto LAB_001a5834;
  }
  else {
    uVar4 = UInt64Field::getValue((UInt64Field *)local_138);
    SVar5 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
    if (SVar5 < uVar4) {
      doTargetTooHigh(this,(Message *)ctx);
      return 0;
    }
    if (local_144 != 0) {
LAB_001a55ef:
      uVar4 = UInt64Field::getValue((UInt64Field *)local_138);
      SVar5 = SessionState::getNextTargetMsgSeqNum(&this->m_state);
      if (uVar4 < SVar5) {
        doTargetTooLow(this,(Message *)ctx);
        return 0;
      }
    }
  }
  pFVar3 = (FieldBase *)(this->m_state).m_resendRange.first;
  this_01 = (IntTConvertor<unsigned_long> *)(this->m_state).m_resendRange.second;
  if ((pFVar3 != (FieldBase *)0x0 || this_01 != (IntTConvertor<unsigned_long> *)0x0) &&
     (pIVar6 = (IntTConvertor<unsigned_long> *)UInt64Field::getValue((UInt64Field *)local_138),
     this_01 <= pIVar6)) {
    IntTConvertor<unsigned_long>::convert_abi_cxx11_
              (&local_70,(IntTConvertor<unsigned_long> *)pFVar3,value);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_50,
                   "ResendRequest for messages FROM: ",&local_70);
    puVar7 = (undefined8 *)std::__cxx11::string::append(local_50._M_local_buf);
    pFVar3 = (FieldBase *)(puVar7 + 2);
    if ((FieldBase *)*puVar7 == pFVar3) {
      local_128._16_8_ = pFVar3->_vptr_FieldBase;
      local_128._24_8_ = puVar7[3];
      local_128._0_8_ = (FieldBase *)(local_128 + 0x10);
    }
    else {
      local_128._16_8_ = pFVar3->_vptr_FieldBase;
      local_128._0_8_ = (FieldBase *)*puVar7;
    }
    local_128._8_8_ = puVar7[1];
    *puVar7 = pFVar3;
    puVar7[1] = 0;
    *(undefined1 *)(puVar7 + 2) = 0;
    IntTConvertor<unsigned_long>::convert_abi_cxx11_(&local_90,this_01,local_128._8_8_);
    std::operator+(&local_b0,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_128,
                   &local_90);
    plVar8 = (long *)std::__cxx11::string::append((char *)&local_b0);
    pSVar10 = (Session *)(plVar8 + 2);
    if ((Session *)*plVar8 == pSVar10) {
      auStack_f8._0_8_ = pSVar10->_vptr_Session;
      auStack_f8._8_8_ = plVar8[3];
      local_108._0_8_ = (Session *)auStack_f8;
    }
    else {
      auStack_f8._0_8_ = pSVar10->_vptr_Session;
      local_108._0_8_ = (Session *)*plVar8;
    }
    local_108._8_8_ = plVar8[1];
    *plVar8 = (long)pSVar10;
    plVar8[1] = 0;
    *(undefined1 *)(plVar8 + 2) = 0;
    SessionState::onEvent(&this->m_state,(string *)local_108);
    if ((Session *)local_108._0_8_ != (Session *)auStack_f8) {
      operator_delete((void *)local_108._0_8_,auStack_f8._0_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
      operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_90._M_dataplus._M_p != &local_90.field_2) {
      operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
    }
    if ((FieldBase *)local_128._0_8_ != (FieldBase *)(local_128 + 0x10)) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_50._M_allocated_capacity != &local_40) {
      operator_delete((void *)local_50._M_allocated_capacity,
                      (ulong)(local_40._M_allocated_capacity + 1));
    }
    pFVar3 = (FieldBase *)&(this->m_state).m_resendRange;
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_70._M_dataplus._M_p != &local_70.field_2) {
      operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
    }
    ((ResendRange *)pFVar3)->first = 0;
    (this->m_state).m_resendRange.second = 0;
    pSVar10 = (Session *)auStack_f8;
  }
LAB_001a5834:
  if ((this->m_timestamper).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(this->m_timestamper)._M_invoker)((UtcTimeStamp *)local_108,(_Any_data *)&this->m_timestamper)
    ;
    (this->m_state).m_lastReceivedTime.super_DateTime.m_date = local_108._8_4_;
    *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.field_0xc = local_108._12_4_;
    *(undefined4 *)&(this->m_state).m_lastReceivedTime.super_DateTime.m_time = auStack_f8._0_4_;
    *(undefined4 *)((long)&(this->m_state).m_lastReceivedTime.super_DateTime.m_time + 4) =
         auStack_f8._4_4_;
    (this->m_state).m_testRequest = 0;
    local_108._0_8_ = &PTR__FieldBase_001f55c8;
    local_108._8_4_ = msgType->m_tag;
    auStack_f8._0_8_ = local_e8;
    pcVar1 = (msgType->m_string)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)auStack_f8,pcVar1,pcVar1 + (msgType->m_string)._M_string_length);
    local_d8._M_p = (pointer)&local_c8;
    local_d0 = (Application *)0x0;
    local_c8._M_local_buf[0] = '\0';
    local_b8 = msgType->m_metrics;
    local_108._0_8_ = &PTR__FieldBase_001f6658;
    fromCallback(this,(MsgType *)local_108,(Message *)ctx,(SessionID *)&PTR__FieldBase_001f6658);
    FieldBase::~FieldBase((FieldBase *)local_108);
    return (int)CONCAT71((int7)((ulong)extraout_RAX >> 8),1);
  }
  auVar11 = std::__throw_bad_function_call();
  if ((Session *)local_108._0_8_ != pSVar10) {
    operator_delete((void *)local_108._0_8_,auStack_f8._0_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_b0._M_dataplus._M_p != &local_b0.field_2) {
    operator_delete(local_b0._M_dataplus._M_p,local_b0.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_90._M_dataplus._M_p != &local_90.field_2) {
    operator_delete(local_90._M_dataplus._M_p,local_90.field_2._M_allocated_capacity + 1);
  }
  if ((FieldBase *)local_128._0_8_ != pFVar3) {
    operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_allocated_capacity != &local_40) {
    operator_delete((void *)local_50._M_allocated_capacity,
                    (ulong)(local_40._M_allocated_capacity + 1));
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  if (auVar11._8_4_ == 1) {
    plVar8 = (long *)__cxa_begin_catch(auVar11._0_8_);
    __s = (char *)(**(code **)(*plVar8 + 0x10))(plVar8);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)local_108,__s,(allocator<char> *)&local_b0);
    SessionState::onEvent(&this->m_state,(string *)local_108);
    if ((Session *)local_108._0_8_ != (Session *)auStack_f8) {
      operator_delete((void *)local_108._0_8_,auStack_f8._0_8_ + 1);
    }
    disconnect(this);
    __cxa_end_catch();
    return 0;
  }
  _Unwind_Resume(auVar11._0_8_);
}

Assistant:

bool Session::verify(const Message &msg, bool checkTooHigh, bool checkTooLow) {
  const MsgType *pMsgType = 0;
  const MsgSeqNum *pMsgSeqNum = 0;

  try {
    const Header &header = msg.getHeader();

    pMsgType = FIELD_GET_PTR(header, MsgType);
    const SenderCompID &senderCompID = FIELD_GET_REF(header, SenderCompID);
    const TargetCompID &targetCompID = FIELD_GET_REF(header, TargetCompID);
    const SendingTime &sendingTime = FIELD_GET_REF(header, SendingTime);

    if (checkTooHigh || checkTooLow) {
      pMsgSeqNum = FIELD_GET_PTR(header, MsgSeqNum);
    }

    if (!validLogonState(*pMsgType)) {
      throw std::logic_error("Logon state is not valid for message");
    }

    if (!isGoodTime(sendingTime)) {
      doBadTime(msg);
      return false;
    }
    if (!isCorrectCompID(senderCompID, targetCompID)) {
      doBadCompID(msg);
      return false;
    }

    if (checkTooHigh && isTargetTooHigh(*pMsgSeqNum)) {
      doTargetTooHigh(msg);
      return false;
    } else if (checkTooLow && isTargetTooLow(*pMsgSeqNum)) {
      doTargetTooLow(msg);
      return false;
    }

    if ((checkTooHigh || checkTooLow) && m_state.resendRequested()) {
      SessionState::ResendRange range = m_state.resendRange();

      if (*pMsgSeqNum >= range.second) {
        m_state.onEvent(
            "ResendRequest for messages FROM: " + SEQNUM_CONVERTOR::convert(range.first)
            + " TO: " + SEQNUM_CONVERTOR::convert(range.second) + " has been satisfied.");
        m_state.resendRange(0, 0);
      }
    }
  } catch (std::exception &e) {
    m_state.onEvent(e.what());
    disconnect();
    return false;
  }

  m_state.lastReceivedTime(m_timestamper());
  m_state.testRequest(0);

  fromCallback(pMsgType ? *pMsgType : MsgType(), msg, m_sessionID);
  return true;
}